

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall JetHead::list<Event_*>::iterator::insertAfter(iterator *this,Event **val)

{
  Node *pNVar1;
  Node *newNode;
  Event **val_local;
  iterator *this_local;
  
  pNVar1 = (Node *)operator_new(0x18);
  pNVar1->val = *val;
  pNVar1->prev = this->mNode;
  pNVar1->next = this->mNode->next;
  this->mNode->next->prev = pNVar1;
  this->mNode->next = pNVar1;
  return;
}

Assistant:

void insertAfter(const T& val)
			{
				Node* newNode = new Node;
				newNode->val = val;
				newNode->prev = mNode;
				newNode->next = mNode->next;

				mNode->next->prev = newNode;
				mNode->next = newNode;
			}